

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int count_obj_list(OBJ_INDEX_DATA *pObjIndex,OBJ_DATA *list)

{
  int nMatch;
  OBJ_DATA *obj;
  OBJ_DATA *list_local;
  OBJ_INDEX_DATA *pObjIndex_local;
  
  nMatch = 0;
  for (obj = list; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
    if (obj->pIndexData == pObjIndex) {
      nMatch = nMatch + 1;
    }
  }
  return nMatch;
}

Assistant:

int count_obj_list(OBJ_INDEX_DATA *pObjIndex, OBJ_DATA *list)
{
	OBJ_DATA *obj;
	int nMatch;

	nMatch = 0;

	for (obj = list; obj != nullptr; obj = obj->next_content)
	{
		if (obj->pIndexData == pObjIndex)
			nMatch++;
	}

	return nMatch;
}